

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void __thiscall Fl_Shared_Image::~Fl_Shared_Image(Fl_Shared_Image *this)

{
  Fl_Shared_Image *this_local;
  
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Shared_Image_002ed440;
  if ((this->name_ != (char *)0x0) && (this->name_ != (char *)0x0)) {
    operator_delete__(this->name_);
  }
  if ((this->alloc_image_ != 0) && (this->image_ != (Fl_Image *)0x0)) {
    (*this->image_->_vptr_Fl_Image[1])();
  }
  Fl_Image::~Fl_Image(&this->super_Fl_Image);
  return;
}

Assistant:

Fl_Shared_Image::~Fl_Shared_Image() {
  if (name_) delete[] (char *)name_;
  if (alloc_image_) delete image_;
#if FLTK_ABI_VERSION >= 10304
  delete scaled_image_;
#endif
}